

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::Softmax_x86_fma::forward_inplace(Softmax_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  long in_RDX;
  float *in_RSI;
  long in_RDI;
  int j;
  int i_5;
  float *ptr_7;
  int q_3;
  float *sumptr_3;
  float *maxptr_3;
  float *maxsumptr_3;
  float *ptr_6;
  int q_2;
  Mat maxsum_3;
  int size_4;
  int i_4;
  float *ptr_5;
  int q_1;
  float *sumptr_2;
  float *maxptr_2;
  float *maxsumptr_2;
  float *ptr_4;
  int i_3;
  int q;
  Mat maxsum_2;
  int size_3;
  float *ptr_3;
  float *sumptr_1;
  float *maxptr_1;
  float *maxsumptr_1;
  int size1_1;
  int i_2;
  int ii_1;
  int nn_size_1;
  Mat maxsum_1;
  int stride_1;
  int sizen_1;
  int size_2;
  float *ptr_2;
  int i_1;
  float *ptr_1;
  float *sumptr;
  float *maxptr;
  float *maxsumptr;
  int size1;
  int i;
  int ii;
  int nn_size;
  Mat maxsum;
  int stride;
  int sizen;
  int size_1;
  int size;
  float *ptr;
  int positive_axis;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  int dims;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  float *in_stack_ffffffffffffefa0;
  Allocator *in_stack_ffffffffffffefb0;
  size_t in_stack_ffffffffffffefb8;
  undefined8 in_stack_ffffffffffffefc0;
  undefined8 in_stack_ffffffffffffefc8;
  Mat *in_stack_ffffffffffffefd0;
  float *in_stack_fffffffffffff028;
  float *_maxptr;
  undefined8 in_stack_fffffffffffff030;
  undefined8 *puVar2;
  int in_stack_fffffffffffff038;
  int in_stack_fffffffffffff03c;
  int iVar3;
  float *in_stack_fffffffffffff040;
  void **_ptr;
  bool local_fa9;
  long in_stack_fffffffffffff1a0;
  float *in_stack_fffffffffffff1a8;
  int local_e04;
  int local_df8;
  int local_df4;
  undefined8 local_df0;
  undefined8 local_de8;
  undefined8 local_de0;
  undefined4 local_dd8;
  long local_dd0;
  undefined4 local_dc8;
  undefined4 local_dc4;
  undefined4 local_dc0;
  undefined4 local_dbc;
  undefined4 local_db8;
  undefined8 local_db0;
  long local_da8;
  int local_d9c;
  void *local_d98;
  void *local_d90;
  undefined8 local_d88;
  undefined8 local_d80;
  undefined8 local_d78;
  undefined4 local_d70;
  long *local_d68;
  undefined4 local_d60;
  undefined4 local_d5c;
  undefined4 local_d58;
  undefined4 local_d54;
  undefined4 local_d50;
  undefined8 local_d48;
  void *local_d40;
  undefined8 local_d38;
  undefined8 local_d30;
  undefined8 local_d28;
  undefined4 local_d20;
  long local_d18;
  undefined4 local_d10;
  undefined4 local_d0c;
  undefined4 local_d08;
  undefined4 local_d04;
  undefined4 local_d00;
  undefined8 local_cf8;
  long local_cf0;
  int local_ce4;
  void *local_ce0;
  int *local_cd8;
  long local_cd0;
  undefined4 local_cc8;
  long *local_cc0;
  undefined4 local_cb8;
  int local_cb4;
  int local_cb0;
  undefined4 local_cac;
  int local_ca8;
  long local_ca0;
  int local_c98;
  int local_c94;
  undefined8 local_c90;
  undefined8 local_c88;
  undefined8 local_c80;
  undefined4 local_c78;
  long local_c70;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined4 local_c60;
  undefined4 local_c5c;
  undefined4 local_c58;
  undefined8 local_c50;
  long local_c48;
  int local_c3c;
  void *local_c38;
  void *local_c30;
  undefined8 local_c28;
  undefined8 local_c20;
  undefined8 local_c18;
  undefined4 local_c10;
  long *local_c08;
  undefined4 local_c00;
  undefined4 local_bfc;
  undefined4 local_bf8;
  undefined4 local_bf4;
  undefined4 local_bf0;
  undefined8 local_be8;
  void *local_be0;
  undefined8 local_bd8;
  undefined8 local_bd0;
  undefined8 local_bc8;
  undefined4 local_bc0;
  long local_bb8;
  undefined4 local_bb0;
  undefined4 local_bac;
  undefined4 local_ba8;
  undefined4 local_ba4;
  undefined4 local_ba0;
  undefined8 local_b98;
  undefined8 local_b90;
  undefined8 local_b88;
  undefined8 local_b80;
  undefined4 local_b78;
  long local_b70;
  undefined4 local_b68;
  undefined4 local_b64;
  undefined4 local_b60;
  undefined4 local_b5c;
  undefined4 local_b58;
  undefined8 local_b50;
  long local_b48;
  int local_b40;
  int local_b3c;
  void *local_b38;
  int *local_b30;
  long local_b28;
  undefined4 local_b20;
  long *local_b18;
  undefined4 local_b10;
  int local_b0c;
  int local_b08;
  undefined4 local_b04;
  int local_b00;
  long local_af8;
  int local_aec;
  long local_ae8;
  void *local_ae0;
  void *local_ad8;
  undefined8 local_ad0;
  undefined8 local_ac8;
  undefined8 local_ac0;
  undefined4 local_ab8;
  long *local_ab0;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined4 local_aa0;
  undefined4 local_a9c;
  undefined4 local_a98;
  undefined8 local_a90;
  void *local_a88;
  int local_a7c;
  int local_a78;
  int local_a74;
  int local_a70;
  int local_a6c;
  void *local_a68;
  int *local_a60;
  long local_a58;
  undefined4 local_a50;
  long *local_a48;
  undefined4 local_a40;
  int local_a3c;
  int local_a38;
  undefined4 local_a34;
  int local_a30;
  long local_a28;
  int local_a1c;
  int local_a18;
  int local_a14;
  long local_a10;
  int local_a04;
  long local_a00;
  void *local_9f8;
  void *local_9f0;
  float local_9e8 [8];
  long *local_9c8;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined8 local_9a8;
  void *local_9a0;
  int local_994;
  int local_990;
  int local_98c;
  int local_988;
  int local_984;
  int local_980;
  void *local_970;
  int *local_968;
  long local_960;
  undefined4 local_958;
  long *local_950;
  undefined4 local_948;
  int local_944;
  int local_940;
  undefined4 local_93c;
  int local_938;
  long local_930;
  int local_928;
  int local_924;
  float local_920;
  int local_91c;
  long local_918;
  int local_90c;
  float local_908;
  float local_904;
  float local_900;
  float local_8fc;
  float local_8f8;
  float local_8f4;
  long local_8f0;
  float *local_8e8;
  int local_8d4;
  undefined8 *local_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  undefined8 *local_8a8;
  undefined8 *local_898;
  float *local_890;
  float *local_888;
  undefined8 local_878;
  undefined8 local_870;
  undefined4 local_864;
  undefined4 local_860;
  int local_85c;
  void **local_858;
  undefined8 local_850;
  undefined8 local_848;
  undefined4 local_83c;
  undefined4 local_838;
  int local_834;
  void **local_830;
  undefined8 local_828;
  undefined8 local_820;
  undefined4 local_814;
  undefined4 local_810;
  int local_80c;
  void **local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined4 local_7ec;
  undefined4 local_7e8;
  int local_7e4;
  void **local_7e0;
  void **local_7d8;
  void **local_7d0;
  void **local_7c8;
  void **local_7c0;
  undefined1 local_7b5;
  int local_7b4;
  undefined8 *local_7a8;
  undefined1 local_79d;
  int local_79c;
  void **local_798;
  undefined8 *local_790;
  undefined1 local_785;
  int local_784;
  undefined8 *local_778;
  undefined1 local_76d;
  int local_76c;
  undefined8 *local_760;
  undefined1 local_755;
  int local_754;
  void **local_750;
  undefined8 *local_748;
  undefined1 local_73d;
  int local_73c;
  undefined8 *local_730;
  undefined1 local_725;
  int local_724;
  void **local_720;
  undefined8 *local_718;
  undefined1 local_70d;
  int local_70c;
  void **local_708;
  float *local_700;
  float *local_6b8;
  void **local_6a8;
  undefined8 *local_698;
  void **local_688;
  undefined8 *local_678;
  undefined8 *local_668;
  undefined8 *local_658;
  void **local_648;
  undefined8 *local_638;
  undefined8 *local_628;
  undefined8 *local_618;
  void **local_608;
  undefined8 *local_5f8;
  int local_5e4;
  float *local_5e0;
  int local_5d4;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  void **local_5c0;
  void **local_5b8;
  void **local_5b0;
  void **local_5a8;
  long *local_5a0;
  undefined4 local_594;
  long local_590;
  void *local_588;
  undefined4 local_57c;
  int local_578;
  int local_574;
  float *local_570;
  long *local_568;
  undefined4 local_55c;
  long local_558;
  void *local_550;
  undefined4 local_544;
  int local_540;
  int local_53c;
  undefined8 *local_538;
  long local_530;
  float local_524;
  long local_520;
  long local_518;
  float local_50c;
  float local_508;
  float local_504;
  undefined8 *local_500;
  long *local_4f8;
  undefined4 local_4ec;
  long local_4e8;
  void *local_4e0;
  undefined4 local_4d4;
  int local_4d0;
  int local_4cc;
  undefined8 *local_4c8;
  long local_4c0;
  float local_4b4;
  long local_4b0;
  long local_4a8;
  float local_49c;
  float local_498;
  float local_494;
  undefined8 *local_490;
  long local_488;
  float local_47c;
  long local_478;
  long local_470;
  float local_464;
  float local_460;
  float local_45c;
  undefined8 *local_458;
  long *local_450;
  undefined4 local_444;
  long local_440;
  void *local_438;
  undefined4 local_42c;
  int local_428;
  int local_424;
  undefined8 *local_420;
  long local_418;
  float local_40c;
  long local_408;
  long local_400;
  float local_3f4;
  float local_3f0;
  float local_3ec;
  undefined8 *local_3e8;
  undefined4 local_3dc;
  long local_3d8;
  undefined4 local_3cc;
  long local_3c8;
  undefined4 local_3bc;
  long local_3b8;
  undefined4 local_3ac;
  long local_3a8;
  undefined4 local_39c;
  long local_398;
  undefined4 local_38c;
  long local_388;
  undefined4 local_37c;
  long local_378;
  undefined4 local_36c;
  long local_368;
  undefined8 *local_348;
  int local_330;
  undefined4 local_32c;
  void **local_328;
  undefined8 *local_308;
  undefined8 *local_2e8;
  undefined8 *local_2c8;
  int local_2b0;
  undefined4 local_2ac;
  void **local_2a8;
  undefined8 *local_288;
  undefined8 *local_268;
  undefined8 *local_248;
  int local_230;
  undefined4 local_22c;
  void **local_228;
  undefined8 *local_208;
  int local_1f0;
  undefined4 local_1ec;
  void **local_1e8;
  float *local_1c8;
  void *local_f0;
  void *local_d0;
  void *local_90;
  void *local_50;
  long local_30;
  float local_24;
  long local_20;
  long local_18;
  float local_10;
  float local_c;
  undefined8 *local_8;
  
  local_8f4 = in_RSI[10];
  local_8f8 = in_RSI[0xb];
  local_8fc = in_RSI[0xc];
  local_900 = in_RSI[0xd];
  local_904 = in_RSI[0xe];
  local_908 = in_RSI[6];
  if (*(int *)(in_RDI + 0xd0) < 0) {
    local_e04 = (int)local_8f4 + *(int *)(in_RDI + 0xd0);
  }
  else {
    local_e04 = *(int *)(in_RDI + 0xd0);
  }
  local_90c = local_e04;
  local_8f0 = in_RDX;
  local_8e8 = in_RSI;
  if (local_8f4 == 1.4013e-45) {
    local_918 = *(long *)in_RSI;
    local_91c = (int)local_8f8 * (int)local_908;
    softmax(in_stack_fffffffffffff1a8,(int)((ulong)in_stack_fffffffffffff1a0 >> 0x20),
            (int)in_stack_fffffffffffff1a0);
  }
  if ((local_8f4 == 2.8026e-45) && (local_90c == 0)) {
    local_920 = local_8f8;
    local_924 = ((int)local_8f8 + *(int *)(local_8f0 + 4) + -1) / *(int *)(local_8f0 + 4);
    local_928 = (int)local_8f8 * (int)local_908;
    local_864 = *(undefined4 *)(local_8f0 + 4);
    local_878 = *(undefined8 *)(local_8f0 + 0x10);
    local_858 = &local_970;
    local_860 = 2;
    local_870 = 4;
    local_970 = (void *)0x0;
    local_968 = (int *)0x0;
    local_960 = 0;
    local_958 = 0;
    local_950 = (long *)0x0;
    local_948 = 0;
    local_944 = 0;
    local_940 = 0;
    local_93c = 0;
    local_938 = 0;
    local_930 = 0;
    local_85c = local_924;
    Mat::create(in_stack_ffffffffffffefd0,(int)((ulong)in_stack_ffffffffffffefc8 >> 0x20),
                (int)in_stack_ffffffffffffefc8,(int)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
                in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
    local_7c0 = &local_970;
    if (local_970 != (void *)0x0) {
      local_5c0 = local_7c0;
    }
    if (local_970 != (void *)0x0 && local_930 * local_938 != 0) {
      local_984 = (int)local_920 / local_924;
      for (local_988 = 0; local_988 < local_984; local_988 = local_988 + 1) {
        local_98c = local_988 * local_924;
        local_994 = (int)local_920 - local_98c;
        piVar1 = std::min<int>(&local_924,&local_994);
        local_990 = *piVar1;
        local_70c = get_omp_thread_num();
        local_700 = local_9e8;
        local_708 = &local_970;
        local_9f0 = (void *)((long)local_970 + local_930 * local_70c * local_960);
        local_570 = local_9e8;
        local_368 = (long)local_944 * (long)local_940 * local_960;
        local_888 = local_9e8;
        in_stack_fffffffffffff1a8 = local_9e8;
        local_9c8 = local_950;
        local_36c = 0x10;
        local_574 = local_944;
        local_578 = local_940;
        local_57c = local_93c;
        local_590 = local_960;
        local_594 = local_958;
        local_5a0 = local_950;
        local_70d = 1;
        local_9e8[0] = 0.0;
        local_9e8[1] = 0.0;
        local_9e8[4] = 0.0;
        local_9e8[5] = 0.0;
        local_9e8[6] = 0.0;
        local_9c0 = 0;
        local_9bc = 0;
        local_9b8 = 0;
        local_9b4 = 0;
        local_9b0 = 0;
        local_9a8 = 0;
        local_9e8[2] = 0.0;
        local_9e8[3] = 0.0;
        local_9f8 = (void *)((long)local_9f0 + (long)local_924 * 4);
        local_890 = local_8e8;
        in_stack_fffffffffffff1a0 = *(long *)local_8e8;
        local_a00 = in_stack_fffffffffffff1a0 + (long)(local_98c * (int)local_908) * 4;
        local_9a0 = local_9f0;
        local_6b8 = in_stack_fffffffffffff1a8;
        local_588 = local_9f0;
        local_1c8 = in_stack_fffffffffffff1a8;
        softmax(in_stack_fffffffffffff040,in_stack_fffffffffffff03c,in_stack_fffffffffffff038,
                (int)((ulong)in_stack_fffffffffffff030 >> 0x20),(int)in_stack_fffffffffffff030,
                in_stack_fffffffffffff028,in_stack_ffffffffffffefa0);
      }
      local_980 = 0;
    }
    else {
      local_8d4 = -100;
      local_980 = 1;
    }
    local_6a8 = &local_970;
    local_1e8 = local_6a8;
    if (local_968 != (int *)0x0) {
      local_1ec = 0xffffffff;
      LOCK();
      local_1f0 = *local_968;
      *local_968 = *local_968 + -1;
      UNLOCK();
      if (local_1f0 == 1) {
        if (local_950 == (long *)0x0) {
          local_f0 = local_970;
          if (local_970 != (void *)0x0) {
            free(local_970);
          }
        }
        else {
          (**(code **)(*local_950 + 0x18))(local_950,local_970);
        }
      }
    }
    local_970 = (void *)0x0;
    local_960 = 0;
    local_958 = 0;
    local_948 = 0;
    local_944 = 0;
    local_940 = 0;
    local_93c = 0;
    local_938 = 0;
    local_930 = 0;
    local_968 = (int *)0x0;
    if (local_980 != 0) {
      return local_8d4;
    }
  }
  if ((local_8f4 == 2.8026e-45) && (local_90c == 1)) {
    for (local_a04 = 0; local_a04 < (int)local_8fc; local_a04 = local_a04 + 1) {
      local_5e0 = local_8e8;
      local_5e4 = local_a04;
      local_a10 = *(long *)local_8e8 +
                  (long)(int)local_8e8[0xb] * (long)local_a04 * *(long *)(local_8e8 + 4);
      softmax(in_stack_fffffffffffff1a8,(int)((ulong)in_stack_fffffffffffff1a0 >> 0x20),
              (int)in_stack_fffffffffffff1a0);
    }
  }
  if (((local_8f4 == 4.2039e-45) || (local_8f4 == 5.60519e-45)) && (local_90c == 0)) {
    local_a14 = (int)local_8f8 * (int)local_8fc * (int)local_900;
    local_a18 = (local_a14 + *(int *)(local_8f0 + 4) + -1) / *(int *)(local_8f0 + 4);
    local_a1c = (int)*(long *)(local_8e8 + 0x10) * (int)local_908;
    local_83c = *(undefined4 *)(local_8f0 + 4);
    local_850 = *(undefined8 *)(local_8f0 + 0x10);
    local_830 = &local_a68;
    local_838 = 2;
    local_848 = 4;
    local_a68 = (void *)0x0;
    local_a60 = (int *)0x0;
    local_a58 = 0;
    local_a50 = 0;
    local_a48 = (long *)0x0;
    local_a40 = 0;
    local_a3c = 0;
    local_a38 = 0;
    local_a34 = 0;
    local_a30 = 0;
    local_a28 = 0;
    local_834 = local_a18;
    Mat::create(in_stack_ffffffffffffefd0,(int)((ulong)in_stack_ffffffffffffefc8 >> 0x20),
                (int)in_stack_ffffffffffffefc8,(int)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
                in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
    local_7c8 = &local_a68;
    if (local_a68 != (void *)0x0) {
      local_5b8 = local_7c8;
    }
    if (local_a68 != (void *)0x0 && local_a28 * local_a30 != 0) {
      local_a6c = local_a14 / local_a18;
      for (local_a70 = 0; local_a70 < local_a6c; local_a70 = local_a70 + 1) {
        local_a74 = local_a70 * local_a18;
        local_a7c = local_a14 - local_a74;
        piVar1 = std::min<int>(&local_a18,&local_a7c);
        local_a78 = *piVar1;
        local_724 = get_omp_thread_num();
        local_718 = &local_ad0;
        local_720 = &local_a68;
        local_ad8 = (void *)((long)local_a68 + local_a28 * local_724 * local_a58);
        local_538 = &local_ad0;
        local_378 = (long)local_a3c * (long)local_a38 * local_a58;
        local_898 = &local_ad0;
        local_698 = &local_ad0;
        local_ab0 = local_a48;
        local_37c = 0x10;
        local_53c = local_a3c;
        local_540 = local_a38;
        local_544 = local_a34;
        local_558 = local_a58;
        local_55c = local_a50;
        local_568 = local_a48;
        local_725 = 1;
        local_ad0 = 0;
        local_ac0 = 0;
        local_ab8 = 0;
        local_aa8 = 0;
        local_aa4 = 0;
        local_aa0 = 0;
        local_a9c = 0;
        local_a98 = 0;
        local_a90 = 0;
        local_ac8 = 0;
        local_ae0 = (void *)((long)local_ad8 + (long)local_a18 * 4);
        local_ae8 = *(long *)local_8e8 + (long)(local_a74 * (int)local_908) * 4;
        local_a88 = local_ad8;
        local_550 = local_ad8;
        local_208 = local_698;
        softmax(in_stack_fffffffffffff040,in_stack_fffffffffffff03c,in_stack_fffffffffffff038,
                (int)((ulong)in_stack_fffffffffffff030 >> 0x20),(int)in_stack_fffffffffffff030,
                in_stack_fffffffffffff028,in_stack_ffffffffffffefa0);
      }
      local_980 = 0;
    }
    else {
      local_8d4 = -100;
      local_980 = 1;
    }
    local_688 = &local_a68;
    local_228 = local_688;
    if (local_a60 != (int *)0x0) {
      local_22c = 0xffffffff;
      LOCK();
      local_230 = *local_a60;
      *local_a60 = *local_a60 + -1;
      UNLOCK();
      if (local_230 == 1) {
        if (local_a48 == (long *)0x0) {
          local_d0 = local_a68;
          if (local_a68 != (void *)0x0) {
            free(local_a68);
          }
        }
        else {
          (**(code **)(*local_a48 + 0x18))(local_a48,local_a68);
        }
      }
    }
    local_a68 = (void *)0x0;
    local_a58 = 0;
    local_a50 = 0;
    local_a40 = 0;
    local_a3c = 0;
    local_a38 = 0;
    local_a34 = 0;
    local_a30 = 0;
    local_a28 = 0;
    local_a60 = (int *)0x0;
    if (local_980 != 0) {
      return local_8d4;
    }
  }
  if (((local_8f4 == 4.2039e-45) && (local_90c == 1)) ||
     ((local_8f4 == 5.60519e-45 && (local_90c == 2)))) {
    local_aec = (int)local_8f8 * (int)local_908;
    local_814 = *(undefined4 *)(local_8f0 + 4);
    local_828 = *(undefined8 *)(local_8f0 + 0x10);
    local_808 = &local_b38;
    local_810 = 2;
    local_820 = 4;
    local_b38 = (void *)0x0;
    local_b30 = (int *)0x0;
    local_b28 = 0;
    local_b20 = 0;
    local_b18 = (long *)0x0;
    local_b10 = 0;
    local_b0c = 0;
    local_b08 = 0;
    local_b04 = 0;
    local_b00 = 0;
    local_af8 = 0;
    local_80c = local_aec;
    Mat::create(in_stack_ffffffffffffefd0,(int)((ulong)in_stack_ffffffffffffefc8 >> 0x20),
                (int)in_stack_ffffffffffffefc8,(int)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
                in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
    local_7d0 = &local_b38;
    if (local_b38 != (void *)0x0) {
      local_5b0 = local_7d0;
    }
    if (local_b38 != (void *)0x0 && local_af8 * local_b00 != 0) {
      for (local_b3c = 0; local_b3c < (int)local_904; local_b3c = local_b3c + 1) {
        for (local_b40 = 0; local_b40 < (int)local_900; local_b40 = local_b40 + 1) {
          local_730 = &local_bd8;
          local_504 = local_8e8[0xb];
          local_508 = local_8e8[0xc];
          local_50c = local_8e8[0xd];
          local_518 = *(long *)local_8e8 +
                      *(long *)(local_8e8 + 0x10) * (long)local_b3c * *(long *)(local_8e8 + 4);
          local_520 = *(long *)(local_8e8 + 4);
          local_524 = local_8e8[6];
          local_530 = *(long *)(local_8e8 + 8);
          local_500 = &local_bd8;
          local_388 = (long)(int)local_504 * (long)(int)local_508 * local_520;
          local_5c8 = &local_b90;
          local_5d0 = &local_bd8;
          local_b48 = local_518 +
                      (long)(int)local_504 * (long)(int)local_508 * (long)local_b40 * local_520;
          local_8 = &local_b90;
          local_8a8 = &local_b90;
          local_678 = &local_b90;
          local_668 = &local_bd8;
          local_b50 = 0;
          local_b58 = 0;
          local_b5c = 0;
          local_b60 = 0;
          local_b64 = 0;
          local_b68 = 0;
          local_b78 = 0;
          local_b80 = 0;
          local_b88 = 0;
          local_b90 = 0;
          local_38c = 0x10;
          local_5d4 = local_b40;
          local_73c = local_b3c;
          local_73d = 1;
          local_bd8 = 0;
          local_bc8 = 0;
          local_bc0 = 0;
          local_bb0 = 0;
          local_bac = 0;
          local_ba8 = 0;
          local_ba4 = 0;
          local_ba0 = 0;
          local_b98 = 0;
          local_bd0 = 0;
          local_268 = local_668;
          local_248 = local_678;
          local_30 = local_530;
          local_24 = local_524;
          local_20 = local_520;
          local_18 = local_b48;
          local_10 = local_508;
          local_c = local_504;
          local_bb8 = local_530;
          local_b70 = local_530;
          local_754 = get_omp_thread_num();
          local_748 = &local_c28;
          local_750 = &local_b38;
          local_c30 = (void *)((long)local_b38 + local_af8 * local_754 * local_b28);
          local_4c8 = &local_c28;
          local_398 = (long)local_b0c * (long)local_b08 * local_b28;
          local_8b0 = &local_c28;
          local_658 = &local_c28;
          local_c08 = local_b18;
          local_39c = 0x10;
          local_4cc = local_b0c;
          local_4d0 = local_b08;
          local_4d4 = local_b04;
          local_4e8 = local_b28;
          local_4ec = local_b20;
          local_4f8 = local_b18;
          local_755 = 1;
          local_c28 = 0;
          local_c18 = 0;
          local_c10 = 0;
          local_c00 = 0;
          local_bfc = 0;
          local_bf8 = 0;
          local_bf4 = 0;
          local_bf0 = 0;
          local_be8 = 0;
          local_c20 = 0;
          local_c38 = (void *)((long)local_c30 + (long)local_aec * 4);
          local_be0 = local_c30;
          local_4e0 = local_c30;
          local_288 = local_658;
          softmax(in_stack_fffffffffffff040,in_stack_fffffffffffff03c,in_stack_fffffffffffff038,
                  (int)((ulong)in_stack_fffffffffffff030 >> 0x20),(int)in_stack_fffffffffffff030,
                  in_stack_fffffffffffff028,in_stack_ffffffffffffefa0);
        }
      }
      local_980 = 0;
    }
    else {
      local_8d4 = -100;
      local_980 = 1;
    }
    local_648 = &local_b38;
    local_2a8 = local_648;
    if (local_b30 != (int *)0x0) {
      local_2ac = 0xffffffff;
      LOCK();
      local_2b0 = *local_b30;
      *local_b30 = *local_b30 + -1;
      UNLOCK();
      if (local_2b0 == 1) {
        if (local_b18 == (long *)0x0) {
          local_90 = local_b38;
          if (local_b38 != (void *)0x0) {
            free(local_b38);
          }
        }
        else {
          (**(code **)(*local_b18 + 0x18))(local_b18,local_b38);
        }
      }
    }
    local_b38 = (void *)0x0;
    local_b28 = 0;
    local_b20 = 0;
    local_b10 = 0;
    local_b0c = 0;
    local_b08 = 0;
    local_b04 = 0;
    local_b00 = 0;
    local_af8 = 0;
    local_b30 = (int *)0x0;
    if (local_980 != 0) {
      return local_8d4;
    }
  }
  iVar3 = (int)((ulong)in_stack_ffffffffffffefc0 >> 0x20);
  if ((local_8f4 == 4.2039e-45) && (local_90c == 2)) {
    for (local_c3c = 0; iVar3 = (int)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
        local_c3c < (int)local_904; local_c3c = local_c3c + 1) {
      local_760 = &local_c90;
      local_494 = local_8e8[0xb];
      local_498 = local_8e8[0xc];
      local_49c = local_8e8[0xd];
      local_c48 = *(long *)local_8e8 +
                  *(long *)(local_8e8 + 0x10) * (long)local_c3c * *(long *)(local_8e8 + 4);
      local_4b0 = *(long *)(local_8e8 + 4);
      local_4b4 = local_8e8[6];
      local_4c0 = *(long *)(local_8e8 + 8);
      local_490 = &local_c90;
      local_3a8 = (long)(int)local_494 * (long)(int)local_498 * local_4b0;
      local_8b8 = &local_c90;
      local_638 = &local_c90;
      local_3ac = 0x10;
      local_76c = local_c3c;
      local_76d = 1;
      local_c90 = 0;
      local_c80 = 0;
      local_c78 = 0;
      local_c68 = 0;
      local_c64 = 0;
      local_c60 = 0;
      local_c5c = 0;
      local_c58 = 0;
      local_c50 = 0;
      local_c88 = 0;
      local_4a8 = local_c48;
      local_2c8 = local_638;
      local_c70 = local_4c0;
      for (local_c94 = 0; local_c94 < (int)local_8fc; local_c94 = local_c94 + 1) {
        softmax(in_stack_fffffffffffff1a8,(int)((ulong)in_stack_fffffffffffff1a0 >> 0x20),
                (int)in_stack_fffffffffffff1a0);
        local_c48 = local_c48 + (long)((int)local_8f8 * (int)local_908) * 4;
      }
    }
  }
  if ((local_8f4 == 5.60519e-45) && (local_90c == 1)) {
    local_c98 = (int)local_8f8 * (int)local_8fc * (int)local_908;
    local_7ec = *(undefined4 *)(local_8f0 + 4);
    local_800 = *(undefined8 *)(local_8f0 + 0x10);
    _ptr = &local_ce0;
    local_7e8 = 2;
    local_7f8 = 4;
    local_ce0 = (void *)0x0;
    local_cd8 = (int *)0x0;
    local_cd0 = 0;
    local_cc8 = 0;
    local_cc0 = (long *)0x0;
    local_cb8 = 0;
    local_cb4 = 0;
    local_cb0 = 0;
    local_cac = 0;
    local_ca8 = 0;
    local_ca0 = 0;
    local_7e4 = local_c98;
    local_7e0 = _ptr;
    Mat::create(in_stack_ffffffffffffefd0,(int)((ulong)in_stack_ffffffffffffefc8 >> 0x20),
                (int)in_stack_ffffffffffffefc8,iVar3,in_stack_ffffffffffffefb8,
                in_stack_ffffffffffffefb0);
    local_7d8 = &local_ce0;
    if (local_ce0 != (void *)0x0) {
      local_5a8 = local_7d8;
    }
    local_fa9 = local_ce0 == (void *)0x0 || local_ca0 * local_ca8 == 0;
    iVar3 = CONCAT13(local_fa9,(int3)in_stack_fffffffffffff03c);
    if (local_fa9) {
      local_8d4 = -100;
      local_980 = 1;
    }
    else {
      for (local_ce4 = 0; local_ce4 < (int)local_904; local_ce4 = local_ce4 + 1) {
        local_778 = &local_d38;
        local_45c = local_8e8[0xb];
        local_460 = local_8e8[0xc];
        local_464 = local_8e8[0xd];
        local_cf0 = *(long *)local_8e8 +
                    *(long *)(local_8e8 + 0x10) * (long)local_ce4 * *(long *)(local_8e8 + 4);
        local_478 = *(long *)(local_8e8 + 4);
        local_47c = local_8e8[6];
        local_488 = *(long *)(local_8e8 + 8);
        puVar2 = &local_d38;
        local_3b8 = (long)(int)local_45c * (long)(int)local_460 * local_478;
        local_8c0 = &local_d38;
        local_628 = &local_d38;
        local_3bc = 0x10;
        local_784 = local_ce4;
        local_785 = 1;
        local_d38 = 0;
        local_d28 = 0;
        local_d20 = 0;
        local_d10 = 0;
        local_d0c = 0;
        local_d08 = 0;
        local_d04 = 0;
        local_d00 = 0;
        local_cf8 = 0;
        local_d30 = 0;
        _maxptr = local_8e8;
        local_470 = local_cf0;
        local_458 = puVar2;
        local_2e8 = local_628;
        local_d18 = local_488;
        local_79c = get_omp_thread_num();
        local_790 = &local_d88;
        local_798 = &local_ce0;
        local_d90 = (void *)((long)local_ce0 + local_ca0 * local_79c * local_cd0);
        local_420 = &local_d88;
        local_3c8 = (long)local_cb4 * (long)local_cb0 * local_cd0;
        local_8c8 = &local_d88;
        local_618 = &local_d88;
        local_d68 = local_cc0;
        local_3cc = 0x10;
        local_424 = local_cb4;
        local_428 = local_cb0;
        local_42c = local_cac;
        local_440 = local_cd0;
        local_444 = local_cc8;
        local_450 = local_cc0;
        local_79d = 1;
        local_d88 = 0;
        local_d78 = 0;
        local_d70 = 0;
        local_d60 = 0;
        local_d5c = 0;
        local_d58 = 0;
        local_d54 = 0;
        local_d50 = 0;
        local_d48 = 0;
        local_d80 = 0;
        local_d98 = (void *)((long)local_d90 + (long)local_c98 * 4);
        local_d40 = local_d90;
        local_438 = local_d90;
        local_308 = local_618;
        softmax((float *)_ptr,iVar3,in_stack_fffffffffffff038,(int)((ulong)puVar2 >> 0x20),
                (int)puVar2,_maxptr,in_stack_ffffffffffffefa0);
      }
      local_980 = 0;
    }
    local_608 = &local_ce0;
    local_328 = local_608;
    if (local_cd8 != (int *)0x0) {
      local_32c = 0xffffffff;
      LOCK();
      local_330 = *local_cd8;
      *local_cd8 = *local_cd8 + -1;
      UNLOCK();
      if (local_330 == 1) {
        if (local_cc0 == (long *)0x0) {
          local_50 = local_ce0;
          if (local_ce0 != (void *)0x0) {
            free(local_ce0);
          }
        }
        else {
          (**(code **)(*local_cc0 + 0x18))(local_cc0,local_ce0);
        }
      }
    }
    local_ce0 = (void *)0x0;
    local_cd0 = 0;
    local_cc8 = 0;
    local_cb8 = 0;
    local_cb4 = 0;
    local_cb0 = 0;
    local_cac = 0;
    local_ca8 = 0;
    local_ca0 = 0;
    local_cd8 = (int *)0x0;
    if (local_980 != 0) {
      return local_8d4;
    }
  }
  if ((local_8f4 == 5.60519e-45) && (local_90c == 3)) {
    for (local_d9c = 0; local_d9c < (int)local_904; local_d9c = local_d9c + 1) {
      local_7a8 = &local_df0;
      local_3ec = local_8e8[0xb];
      local_3f0 = local_8e8[0xc];
      local_3f4 = local_8e8[0xd];
      local_da8 = *(long *)local_8e8 +
                  *(long *)(local_8e8 + 0x10) * (long)local_d9c * *(long *)(local_8e8 + 4);
      local_408 = *(long *)(local_8e8 + 4);
      local_40c = local_8e8[6];
      local_418 = *(long *)(local_8e8 + 8);
      local_3e8 = &local_df0;
      local_3d8 = (long)(int)local_3ec * (long)(int)local_3f0 * local_408;
      local_8d0 = &local_df0;
      local_5f8 = &local_df0;
      local_3dc = 0x10;
      local_7b4 = local_d9c;
      local_7b5 = 1;
      local_df0 = 0;
      local_de0 = 0;
      local_dd8 = 0;
      local_dc8 = 0;
      local_dc4 = 0;
      local_dc0 = 0;
      local_dbc = 0;
      local_db8 = 0;
      local_db0 = 0;
      local_de8 = 0;
      local_400 = local_da8;
      local_348 = local_5f8;
      local_dd0 = local_418;
      for (local_df4 = 0; local_df4 < (int)local_900; local_df4 = local_df4 + 1) {
        for (local_df8 = 0; local_df8 < (int)local_8fc; local_df8 = local_df8 + 1) {
          softmax(in_stack_fffffffffffff1a8,(int)((ulong)in_stack_fffffffffffff1a0 >> 0x20),
                  (int)in_stack_fffffffffffff1a0);
          local_da8 = local_da8 + (long)((int)local_8f8 * (int)local_908) * 4;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Softmax_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int d = bottom_top_blob.d;
    const int channels = bottom_top_blob.c;
    const int elempack = bottom_top_blob.elempack;
    const int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        float* ptr = bottom_top_blob;

        const int size = w * elempack;

        softmax(ptr, size, 1);
    }

    if (dims == 2 && positive_axis == 0)
    {
        const int size = w;
        const int sizen = (size + (opt.num_threads - 1)) / opt.num_threads;
        const int stride = w * elempack;

        Mat maxsum(sizen, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        const int nn_size = size / sizen;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            const int i = ii * sizen;
            const int size1 = std::min(sizen, size - i);

            float* maxsumptr = maxsum.channel(get_omp_thread_num());
            float* maxptr = maxsumptr;
            float* sumptr = maxptr + sizen;

            float* ptr = (float*)bottom_top_blob + i * elempack;

            softmax(ptr, h, elempack, stride, size1, maxptr, sumptr);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            softmax(ptr, w, elempack);
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        const int size = w * h * d;
        const int sizen = (size + (opt.num_threads - 1)) / opt.num_threads;
        const int stride = bottom_top_blob.cstep * elempack;

        Mat maxsum(sizen, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        const int nn_size = size / sizen;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            const int i = ii * sizen;
            const int size1 = std::min(sizen, size - i);

            float* maxsumptr = maxsum.channel(get_omp_thread_num());
            float* maxptr = maxsumptr;
            float* sumptr = maxptr + sizen;

            float* ptr = (float*)bottom_top_blob + i * elempack;

            softmax(ptr, channels, elempack, stride, size1, maxptr, sumptr);
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        const int size = w * elempack;

        Mat maxsum(size, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            for (int i = 0; i < d; i++)
            {
                float* ptr = bottom_top_blob.channel(q).depth(i);

                float* maxsumptr = maxsum.channel(get_omp_thread_num());
                float* maxptr = maxsumptr;
                float* sumptr = maxptr + size;

                softmax(ptr, h, 1, size, size, maxptr, sumptr);
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                softmax(ptr, w, elempack);
                ptr += w * elempack;
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        const int size = w * h * elempack;

        Mat maxsum(size, 2, opt.num_threads, 4u, opt.workspace_allocator);
        if (maxsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float* maxsumptr = maxsum.channel(get_omp_thread_num());
            float* maxptr = maxsumptr;
            float* sumptr = maxptr + size;

            softmax(ptr, d, 1, size, size, maxptr, sumptr);
        }
    }

    if (dims == 4 && positive_axis == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    softmax(ptr, w, elempack);
                    ptr += w * elempack;
                }
            }
        }
    }

    return 0;
}